

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseScriptModule
          (WastParser *this,
          unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> *out_module)

{
  _func_int **pp_Var1;
  ScriptModule *pSVar2;
  bool bVar3;
  Result RVar4;
  TokenType TVar5;
  TokenType TVar6;
  Result RVar7;
  ScriptModule *pSVar8;
  undefined **ppuVar9;
  TokenTypePair pair;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Location loc;
  string name;
  ScriptModule *local_d0;
  Token local_c8;
  anon_union_16_2_ecfd7102_for_Location_1 *local_88;
  size_type sStack_80;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_78;
  undefined8 uStack_70;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_c8,this);
  local_78.offset = (size_t)local_c8.loc.field_1.field_1.offset;
  uStack_70 = local_c8.loc.field_1._8_8_;
  local_88 = (anon_union_16_2_ecfd7102_for_Location_1 *)local_c8.loc.filename.data_;
  sStack_80 = local_c8.loc.filename.size_;
  RVar4 = Expect(this,Module);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ParseBindVarOpt(this,&local_68);
  TVar5 = Peek(this,0);
  if (TVar5 == Quote) {
    Consume(&local_c8,this);
    local_c8.loc.filename.data_ = (char *)0x0;
    local_c8.loc.filename.size_ = 0;
    local_c8.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    bVar3 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8
                            );
    if (bVar3) {
      pSVar8 = (ScriptModule *)operator_new(0x68);
      pSVar8->_vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar8->type_ = 0;
      pSVar8[2]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar8[2].type_ = 0;
      pSVar8[1]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar8[1].type_ = 0;
      pSVar8[3]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar8[3].type_ = 0;
      pSVar8[4]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar8[4].type_ = 0;
      pSVar8->type_ = Quoted;
      ppuVar9 = &PTR__DataScriptModule_001eac00;
LAB_00176439:
      pSVar8->_vptr_ScriptModule = (_func_int **)ppuVar9;
      *(undefined8 *)&pSVar8[1].field_0xc = 0;
      *(undefined8 *)((long)&pSVar8[2]._vptr_ScriptModule + 4) = 0;
      pSVar8[3]._vptr_ScriptModule = (_func_int **)(pSVar8 + 4);
      pSVar8[5]._vptr_ScriptModule = (_func_int **)0x0;
      *(undefined8 *)&pSVar8[5].type_ = 0;
      pSVar8[6]._vptr_ScriptModule = (_func_int **)0x0;
      std::__cxx11::string::_M_assign((string *)(pSVar8 + 3));
      pSVar8[2]._vptr_ScriptModule = (_func_int **)local_78.offset;
      *(undefined8 *)&pSVar8[2].type_ = uStack_70;
      pSVar8[1]._vptr_ScriptModule = (_func_int **)local_88;
      *(size_type *)&pSVar8[1].type_ = sStack_80;
      pp_Var1 = pSVar8[5]._vptr_ScriptModule;
      pSVar8[5]._vptr_ScriptModule = (_func_int **)local_c8.loc.filename.data_;
      *(size_type *)&pSVar8[5].type_ = local_c8.loc.filename.size_;
      pSVar8[6]._vptr_ScriptModule = (_func_int **)local_c8.loc.field_1.field_1.offset;
      local_c8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      local_c8.loc.filename.data_ = (char *)0x0;
      local_c8.loc.filename.size_ = 0;
      if (pp_Var1 != (_func_int **)0x0) {
        operator_delete(pp_Var1);
      }
      pSVar2 = (out_module->_M_t).
               super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
               .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
      (out_module->_M_t).
      super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
      super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
      super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = pSVar8;
      if (pSVar2 != (ScriptModule *)0x0) {
        (*pSVar2->_vptr_ScriptModule[1])();
      }
    }
LAB_001764b7:
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_c8.loc.filename.data_ !=
        (anon_union_16_2_ecfd7102_for_Location_1 *)0x0) {
      operator_delete(local_c8.loc.filename.data_);
    }
    RVar4.enum_ = Error;
    if (bVar3 == false) goto LAB_001764e6;
  }
  else {
    if (TVar5 == Bin) {
      Consume(&local_c8,this);
      local_c8.loc.filename.data_ = (char *)0x0;
      local_c8.loc.filename.size_ = 0;
      local_c8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      bVar3 = ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &local_c8);
      if (bVar3) {
        pSVar8 = (ScriptModule *)operator_new(0x68);
        pSVar8->_vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar8->type_ = 0;
        pSVar8[2]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar8[2].type_ = 0;
        pSVar8[1]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar8[1].type_ = 0;
        pSVar8[3]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar8[3].type_ = 0;
        pSVar8[4]._vptr_ScriptModule = (_func_int **)0x0;
        *(undefined8 *)&pSVar8[4].type_ = 0;
        pSVar8->type_ = Binary;
        ppuVar9 = &PTR__DataScriptModule_001eab98;
        goto LAB_00176439;
      }
      goto LAB_001764b7;
    }
    MakeUnique<wabt::TextScriptModule>();
    std::__cxx11::string::_M_assign((string *)(local_d0 + 3));
    local_d0[2]._vptr_ScriptModule = (_func_int **)local_78.offset;
    *(undefined8 *)&local_d0[2].type_ = uStack_70;
    local_d0[1]._vptr_ScriptModule = (_func_int **)local_88;
    *(size_type *)&local_d0[1].type_ = sStack_80;
    TVar5 = Peek(this,0);
    TVar6 = Peek(this,1);
    pair._M_elems[1] = TVar6;
    pair._M_elems[0] = TVar5;
    bVar3 = anon_unknown_1::IsModuleField(pair);
    if (bVar3) {
      RVar7 = ParseModuleFieldList(this,(Module *)(local_d0 + 1));
      RVar4.enum_ = Error;
      if (RVar7.enum_ != Error) goto LAB_00176596;
LAB_00176658:
      if (local_d0 != (ScriptModule *)0x0) {
        (*local_d0->_vptr_ScriptModule[1])();
      }
      goto LAB_001764e6;
    }
    TVar5 = Peek(this,0);
    if (TVar5 != Rpar) {
      Match(this,Lpar);
      local_c8.loc.filename.data_ = (char *)&local_c8.loc.field_1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"a module field","");
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_c8,&local_c8.token_type_);
      RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_c8.loc.filename.data_ !=
          &local_c8.loc.field_1) {
        operator_delete(local_c8.loc.filename.data_);
      }
      goto LAB_00176658;
    }
LAB_00176596:
    pSVar8 = (out_module->_M_t).
             super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
             super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl;
    (out_module->_M_t).
    super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>._M_t.
    super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>.
    super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl = local_d0;
    if (pSVar8 != (ScriptModule *)0x0) {
      (*pSVar8->_vptr_ScriptModule[1])();
    }
  }
  RVar4 = Expect(this,Rpar);
  RVar4.enum_ = (Enum)(RVar4.enum_ == Error);
LAB_001764e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return (Result)RVar4.enum_;
}

Assistant:

Result WastParser::ParseScriptModule(
    std::unique_ptr<ScriptModule>* out_module) {
  WABT_TRACE(ParseScriptModule);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Module);
  std::string name;
  ParseBindVarOpt(&name);

  switch (Peek()) {
    case TokenType::Bin: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto bsm = MakeUnique<BinaryScriptModule>();
      bsm->name = name;
      bsm->loc = loc;
      bsm->data = std::move(data);
      *out_module = std::move(bsm);
      break;
    }

    case TokenType::Quote: {
      Consume();
      std::vector<uint8_t> data;
      // TODO(binji): The spec allows this to be empty, switch to
      // ParseTextListOpt.
      CHECK_RESULT(ParseTextList(&data));

      auto qsm = MakeUnique<QuotedScriptModule>();
      qsm->name = name;
      qsm->loc = loc;
      qsm->data = std::move(data);
      *out_module = std::move(qsm);
      break;
    }

    default: {
      auto tsm = MakeUnique<TextScriptModule>();
      tsm->module.name = name;
      tsm->module.loc = loc;
      if (IsModuleField(PeekPair())) {
        CHECK_RESULT(ParseModuleFieldList(&tsm->module));
      } else if (!PeekMatch(TokenType::Rpar)) {
        ConsumeIfLpar();
        return ErrorExpected({"a module field"});
      }
      *out_module = std::move(tsm);
      break;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}